

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void anon_unknown.dwarf_5db41::signal_handler(int signal)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream os;
  char *local_1b0;
  ostringstream local_190 [376];
  
  pcVar1 = strsignal(signal);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"received signal ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,signal);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,")");
  std::__cxx11::stringbuf::str();
  abnormal_program_termination(local_1b0);
}

Assistant:

void signal_handler(int signal) {
        const char* sigstr = strsignal(signal);
        std::ostringstream os;
        os << "received signal " << signal << " (" << sigstr << ")";
        abnormal_program_termination(os.str().c_str());
    }